

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O2

void __thiscall
amrex::StateDescriptor::setUpMaps
          (StateDescriptor *this,int *use_default_map,InterpBase *default_map,int start_comp,
          int num_comp,InterpBase ***maps,int *nmaps,int **map_start_comp,int **map_num_comp,
          int **max_start_comp,int **min_end_comp)

{
  pointer ppIVar1;
  InterpBase *pIVar2;
  InterpBase **ppIVar3;
  int *piVar4;
  InterpBase *pIVar5;
  pointer piVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  pointer piVar11;
  InterpBase *pIVar12;
  int *piVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  
  *maps = (InterpBase **)0x0;
  *map_start_comp = (int *)0x0;
  *map_num_comp = (int *)0x0;
  *max_start_comp = (int *)0x0;
  *min_end_comp = (int *)0x0;
  ppIVar1 = (this->mapper_comp).
            super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
            super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar5 = ppIVar1[start_comp];
  if (pIVar5 == (InterpBase *)0x0) {
    pIVar5 = default_map;
  }
  *nmaps = 1;
  *use_default_map = 1;
  lVar16 = (long)(start_comp + 1);
  for (lVar9 = lVar16; lVar9 < num_comp + start_comp; lVar9 = lVar9 + 1) {
    pIVar2 = ppIVar1[lVar9];
    pIVar12 = default_map;
    if (pIVar2 != (InterpBase *)0x0) {
      *use_default_map = 0;
      pIVar12 = pIVar2;
    }
    if (pIVar5 != pIVar12) {
      *nmaps = *nmaps + 1;
      pIVar5 = pIVar12;
    }
  }
  if (*use_default_map == 0) {
    lVar9 = (long)*nmaps;
    uVar10 = lVar9 * 8;
    if (lVar9 < 0) {
      uVar10 = 0xffffffffffffffff;
    }
    uVar15 = lVar9 * 4;
    if (lVar9 < 0) {
      uVar15 = 0xffffffffffffffff;
    }
    ppIVar3 = (InterpBase **)operator_new__(uVar10);
    *maps = ppIVar3;
    piVar4 = (int *)operator_new__(uVar15);
    *map_start_comp = piVar4;
    piVar4 = (int *)operator_new__(uVar15);
    *map_num_comp = piVar4;
    piVar4 = (int *)operator_new__(uVar15);
    *min_end_comp = piVar4;
    piVar4 = (int *)operator_new__(uVar15);
    *max_start_comp = piVar4;
    pIVar5 = (this->mapper_comp).
             super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
             super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
             super__Vector_impl_data._M_start[start_comp];
    if (pIVar5 == (InterpBase *)0x0) {
      pIVar5 = default_map;
    }
    **maps = pIVar5;
    **map_start_comp = start_comp;
    piVar4 = *map_num_comp;
    *piVar4 = 1;
    piVar6 = (this->min_map_end_comp).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar8 = *min_end_comp;
    *piVar8 = piVar6[start_comp];
    piVar11 = (this->max_map_start_comp).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    piVar13 = *max_start_comp;
    *piVar13 = piVar11[start_comp];
    iVar7 = 0;
    for (; lVar16 < num_comp + start_comp; lVar16 = lVar16 + 1) {
      pIVar5 = (this->mapper_comp).
               super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
               super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl
               .super__Vector_impl_data._M_start[lVar16];
      if (pIVar5 == (InterpBase *)0x0) {
        pIVar5 = default_map;
      }
      if ((*maps)[iVar7] == pIVar5) {
        piVar4[iVar7] = piVar4[iVar7] + 1;
        iVar14 = piVar6[lVar16];
        if (piVar6[lVar16] < piVar8[iVar7]) {
          iVar14 = piVar8[iVar7];
        }
        piVar8[iVar7] = iVar14;
        iVar14 = piVar13[iVar7];
        if (piVar11[lVar16] < piVar13[iVar7]) {
          iVar14 = piVar11[lVar16];
        }
        piVar13[iVar7] = iVar14;
      }
      else {
        (*maps)[(long)iVar7 + 1] = pIVar5;
        (*map_start_comp)[(long)iVar7 + 1] = (int)lVar16;
        piVar4 = *map_num_comp;
        piVar4[(long)iVar7 + 1] = 1;
        piVar6 = (this->min_map_end_comp).super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        piVar8 = *min_end_comp;
        piVar8[(long)iVar7 + 1] = piVar6[lVar16];
        piVar11 = (this->max_map_start_comp).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        piVar13 = *max_start_comp;
        piVar13[(long)iVar7 + 1] = piVar11[lVar16];
        iVar7 = iVar7 + 1;
      }
    }
  }
  return;
}

Assistant:

void
StateDescriptor::setUpMaps (int&                use_default_map,
                            const InterpBase*   default_map,
                            int                 start_comp,
                            int                 num_comp,
                            InterpBase**&       maps,
                            int&                nmaps,
                            int*&               map_start_comp,
                            int*&               map_num_comp,
                            int*&               max_start_comp,
                            int*&               min_end_comp) const
{
    BL_ASSERT(start_comp>=0 && start_comp+num_comp-1 < ncomp && num_comp>0);

    maps           = 0;
    map_start_comp = 0;
    map_num_comp   = 0;
    max_start_comp = 0;
    min_end_comp   = 0;
    //
    // First, count number of interpolaters needed and allocate.
    //
    InterpBase* map = mapper_comp[start_comp];
    if (!map) map = (InterpBase*) default_map;
    nmaps = 1;
    int icomp = start_comp+1;

    use_default_map = 1;
    while (icomp < start_comp+num_comp)
    {
        InterpBase* mapper_icomp = mapper_comp[icomp];
        if (!mapper_icomp)
        {
            mapper_icomp = (InterpBase *) default_map;
        }
        else
        {
            use_default_map = 0;
        }
        if (map != mapper_icomp)
        {
            map = mapper_icomp;
            nmaps++;
        }
        icomp++;
    }

    if (use_default_map) return;

    maps           = new InterpBase*[nmaps];
    map_start_comp = new int[nmaps];
    map_num_comp   = new int[nmaps];
    min_end_comp   = new int[nmaps];
    max_start_comp = new int[nmaps];
    //
    // Now fill the slots.
    //
    int imap             = 0;

    if (mapper_comp[start_comp])
    {
        maps[imap] = mapper_comp[start_comp];
    }
    else
    {
        maps[imap] = (InterpBase *) default_map;
    }

    icomp                = start_comp+1;
    map_start_comp[imap] = start_comp;
    map_num_comp[imap]   = 1;
    min_end_comp[imap]   = min_map_end_comp[start_comp];
    max_start_comp[imap] = max_map_start_comp[start_comp];

    while (icomp < start_comp+num_comp)
    {
        InterpBase* mapper_icomp = mapper_comp[icomp];

        if (!mapper_icomp)
            mapper_icomp = (InterpBase *) default_map;

        if (maps[imap] != mapper_icomp)
        {
            imap++;

            BL_ASSERT (imap < nmaps);

            maps[imap]           = mapper_icomp;
            map_start_comp[imap] = icomp;
            map_num_comp[imap]   = 1;
            min_end_comp[imap]   = min_map_end_comp[icomp];
            max_start_comp[imap] = max_map_start_comp[icomp];

        }
        else
        {
            map_num_comp[imap]++;
            min_end_comp[imap]   = std::max(min_end_comp[imap],min_map_end_comp[icomp]);
            max_start_comp[imap] = std::min(max_start_comp[imap],max_map_start_comp[icomp]);
        }
        icomp++;
    }
}